

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Response *res_00;
  Stream *strm_00;
  bool bVar3;
  HandlerResponse HVar4;
  int iVar5;
  ostream *poVar6;
  _Alloc_hider _Var7;
  const_iterator cVar8;
  ssize_t sVar9;
  Server *pSVar10;
  _Base_ptr p_Var11;
  long lVar12;
  undefined4 extraout_var;
  Server *pSVar13;
  char *__s;
  long lVar14;
  char cVar15;
  bool bVar16;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar17;
  string boundary;
  string content_type;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char *local_230;
  string local_228;
  string local_208;
  Response *local_1e8;
  Stream *local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined8 local_1b0;
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  local_1e0 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                  ,0x13b2,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar4 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    need_apply_ranges = HVar4 == Handled || need_apply_ranges;
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  if (need_apply_ranges != false) {
    apply_ranges(this,req,res,&local_208,&local_228);
  }
  bVar16 = true;
  if (!close_connection) {
    local_1d8._0_8_ = &((key_type *)local_1d8)->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Connection","");
    pVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(req->headers)._M_t,(key_type *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &((key_type *)local_1d8)->field_2) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (pVar17.first._M_node._M_node == pVar17.second._M_node._M_node) {
      __s = "";
    }
    else {
      __s = *(char **)(pVar17.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,__s,(allocator<char> *)local_1d8);
    iVar5 = std::__cxx11::string::compare((char *)local_50);
    bVar16 = iVar5 == 0;
  }
  if ((!close_connection) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar16) {
    local_1d8._0_8_ = "Connection";
    local_250._M_dataplus._M_p = "close";
    cVar15 = 'C';
    bVar16 = true;
    lVar14 = 1;
    do {
      if ((cVar15 == '\n') || (cVar15 == '\r')) break;
      cVar15 = "Connection"[lVar14];
      bVar16 = cVar15 != '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xb);
    if (!bVar16) {
      cVar15 = 'c';
      bVar16 = true;
      lVar14 = 1;
      do {
        if ((cVar15 == '\n') || (cVar15 == '\r')) break;
        cVar15 = "close"[lVar14];
        bVar16 = cVar15 != '\0';
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      if (!bVar16) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,char_const*&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,(char **)local_1d8,(char **)&local_250);
      }
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&((key_type *)local_1d8)->field_2,"timeout=",8);
    poVar6 = std::ostream::_M_insert<long>((long)&((key_type *)local_1d8)->field_2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__cxx11::stringbuf::str();
    local_230 = "Keep-Alive";
    cVar15 = 'K';
    bVar16 = true;
    lVar14 = 1;
    do {
      if ((cVar15 == '\n') || (cVar15 == '\r')) break;
      cVar15 = "Keep-Alive"[lVar14];
      bVar16 = cVar15 != '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xb);
    if (!bVar16) {
      cVar15 = *local_250._M_dataplus._M_p;
      _Var7._M_p = local_250._M_dataplus._M_p;
      while (((cVar15 != '\0' && (_Var7._M_p = _Var7._M_p + 1, cVar15 != '\n')) && (cVar15 != '\r'))
            ) {
        cVar15 = *_Var7._M_p;
      }
      if (cVar15 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,&local_230,&local_250);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  paVar2 = &((key_type *)local_1d8)->field_2;
  local_1d8._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Type","");
  this_00 = &res->headers;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != paVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  p_Var1 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)cVar8._M_node == p_Var1) &&
     ((((res->body)._M_string_length != 0 || (res->content_length_ != 0)) ||
      ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)))) {
    local_1d8._0_8_ = "Content-Type";
    local_250._M_dataplus._M_p = "text/plain";
    cVar15 = 'C';
    bVar16 = true;
    lVar14 = 1;
    do {
      if ((cVar15 == '\n') || (cVar15 == '\r')) break;
      cVar15 = "Content-Type"[lVar14];
      bVar16 = cVar15 != '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xd);
    if (!bVar16) {
      cVar15 = 't';
      bVar16 = true;
      lVar14 = 1;
      do {
        if ((cVar15 == '\n') || (cVar15 == '\r')) break;
        cVar15 = "text/plain"[lVar14];
        bVar16 = cVar15 != '\0';
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xb);
      if (!bVar16) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,char_const*&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,(char **)local_1d8,(char **)&local_250);
      }
    }
  }
  local_1d8._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Length","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != paVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (((((_Rb_tree_header *)cVar8._M_node == p_Var1) && ((res->body)._M_string_length == 0)) &&
      (res->content_length_ == 0)) &&
     ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_1d8._0_8_ = "Content-Length";
    local_250._M_dataplus._M_p = "0";
    cVar15 = 'C';
    bVar16 = true;
    lVar14 = 1;
    do {
      if ((cVar15 == '\n') || (cVar15 == '\r')) break;
      cVar15 = "Content-Length"[lVar14];
      bVar16 = cVar15 != '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xf);
    if (!bVar16) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)local_1d8,(char **)&local_250);
    }
  }
  local_1d8._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Accept-Ranges","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != paVar2) {
    operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
  }
  if (((_Rb_tree_header *)cVar8._M_node == p_Var1) &&
     (iVar5 = std::__cxx11::string::compare((char *)req), iVar5 == 0)) {
    local_1d8._0_8_ = "Accept-Ranges";
    local_250._M_dataplus._M_p = "bytes";
    cVar15 = 'A';
    bVar16 = true;
    lVar14 = 1;
    do {
      if ((cVar15 == '\n') || (cVar15 == '\r')) break;
      cVar15 = "Accept-Ranges"[lVar14];
      bVar16 = cVar15 != '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xe);
    if (!bVar16) {
      cVar15 = 'b';
      bVar16 = true;
      lVar14 = 1;
      do {
        if ((cVar15 == '\n') || (cVar15 == '\r')) break;
        cVar15 = "bytes"[lVar14];
        bVar16 = cVar15 != '\0';
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      if (!bVar16) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,char_const*&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,(char **)local_1d8,(char **)&local_250);
      }
    }
  }
  if ((this->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->post_routing_handler_)._M_invoker)((_Any_data *)&this->post_routing_handler_,req,res);
  }
  local_1d8._8_8_ = (long)(((key_type *)local_1d8)->field_2)._M_local_buf + 8;
  local_1d8._0_8_ = &PTR__BufferStream_001701a8;
  local_1c8._M_allocated_capacity = 0;
  local_1c8._M_local_buf[8] = '\0';
  local_1b0 = 0;
  local_250._M_dataplus._M_p = detail::status_message(res->status);
  sVar9 = Stream::write_format<int,char_const*>
                    ((Stream *)local_1d8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_250);
  if (sVar9 != 0) {
    p_Var11 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar16 = (_Rb_tree_header *)p_Var11 == p_Var1;
    local_1e8 = res;
    if (bVar16) {
      lVar14 = 0;
      pSVar10 = this;
    }
    else {
      lVar14 = 0;
      do {
        local_250._M_dataplus._M_p = *(pointer *)(p_Var11 + 1);
        local_230 = *(char **)(p_Var11 + 2);
        pSVar10 = (Server *)
                  Stream::write_format<char_const*,char_const*>
                            ((Stream *)local_1d8,"%s: %s\r\n",(char **)&local_250,&local_230);
        pSVar13 = (Server *)0x0;
        if (-1 < (long)pSVar10) {
          pSVar13 = pSVar10;
        }
        lVar14 = (long)&pSVar13->_vptr_Server + lVar14;
        if ((long)pSVar10 < 0) break;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        bVar16 = (_Rb_tree_header *)p_Var11 == p_Var1;
        pSVar10 = this;
      } while (!bVar16);
    }
    if (bVar16) {
      lVar12 = (**(code **)(local_1d8._0_8_ + 0x28))((key_type *)local_1d8,"\r\n",2);
      if (lVar12 < 0) {
        lVar14 = 0;
      }
      pSVar10 = (Server *)(lVar14 + lVar12);
    }
    strm_00 = local_1e0;
    res_00 = local_1e8;
    if (pSVar10 != (Server *)0x0) {
      (*local_1e0->_vptr_Stream[5])(local_1e0,local_1d8._8_8_,local_1c8._M_allocated_capacity);
      local_1d8._0_8_ = &PTR__BufferStream_001701a8;
      if ((undefined1 *)local_1d8._8_8_ !=
          (undefined1 *)((long)(((key_type *)local_1d8)->field_2)._M_local_buf + 8U)) {
        operator_delete((void *)local_1d8._8_8_,
                        CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)req);
      bVar16 = true;
      if (iVar5 != 0) {
        if ((res_00->body)._M_string_length == 0) {
          if ((res_00->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar3 = write_content_with_provider(this,strm_00,req,res_00,&local_228,&local_208);
            if (bVar3) {
              res_00->content_provider_success_ = true;
            }
            else {
              res_00->content_provider_success_ = false;
              bVar16 = false;
            }
          }
        }
        else {
          iVar5 = (*strm_00->_vptr_Stream[5])(strm_00,(res_00->body)._M_dataplus._M_p);
          bVar16 = CONCAT44(extraout_var,iVar5) != 0;
        }
      }
      if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->logger_)._M_invoker)((_Any_data *)&this->logger_,req,res_00);
      }
      goto LAB_001410ec;
    }
  }
  local_1d8._0_8_ = &PTR__BufferStream_001701a8;
  if ((undefined1 *)local_1d8._8_8_ !=
      (undefined1 *)((long)(((key_type *)local_1d8)->field_2)._M_local_buf + 8U)) {
    operator_delete((void *)local_1d8._8_8_,CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1)
    ;
  }
  bVar16 = false;
LAB_001410ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  return bVar16;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { ret = false; }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}